

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O0

void __thiscall
cmXMLWriter::Attribute<std::__cxx11::string>
          (cmXMLWriter *this,char *name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  ostream *poVar1;
  cmXMLSafe local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  char *name_local;
  cmXMLWriter *this_local;
  
  local_20 = value;
  value_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name;
  name_local = (char *)this;
  PreAttribute(this);
  poVar1 = std::operator<<(this->Output,(char *)value_local);
  poVar1 = std::operator<<(poVar1,"=\"");
  SafeAttribute(&local_38,local_20);
  poVar1 = ::operator<<(poVar1,&local_38);
  std::operator<<(poVar1,'\"');
  return;
}

Assistant:

void Attribute(const char* name, T const& value)
  {
    this->PreAttribute();
    this->Output << name << "=\"" << SafeAttribute(value) << '"';
  }